

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall QtMWidgets::TableViewCellLayout::setGeometry(TableViewCellLayout *this,QRect *rect)

{
  qsizetype qVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  QWidget *this_00;
  int iVar9;
  int ay;
  undefined1 auVar10 [16];
  QRect QVar11;
  QArrayDataPointer<char16_t> local_78;
  undefined8 local_60;
  QArrayDataPointer<char16_t> local_58;
  QRect r;
  
  QLayout::setGeometry((QRect *)this);
  auVar10 = QLayout::contentsMargins();
  QVar11 = QRect::adjusted(rect,auVar10._0_4_,auVar10._4_4_,-auVar10._8_4_,-auVar10._12_4_);
  r = QVar11;
  lVar6 = (**(code **)(*(long *)this->accessoryWidget + 0x70))();
  QLabel::pixmap();
  cVar2 = QPixmap::isNull();
  ay = QVar11.y1;
  iVar8 = (int)((ulong)lVar6 >> 0x20);
  iVar5 = (int)lVar6;
  iVar4 = QVar11.x1;
  if (cVar2 == '\0') {
    QLabel::text();
    qVar1 = local_58.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QPixmap::~QPixmap((QPixmap *)&local_78);
    if (qVar1 != 0) goto LAB_0016d1bb;
    iVar3 = 0;
    QWidget::setGeometry((QWidget *)this->imageLabel,iVar4,ay,0,0);
LAB_0016d270:
    if ((iVar8 == 0 || lVar6 < 0) || iVar5 < 1) {
      QWidget::setGeometry(this->accessoryWidget,iVar4,ay,0,0);
      iVar5 = 0;
    }
    else {
      local_60 = QVar11._8_8_;
      TextLabel::text((QString *)&local_78,this->textLabel);
      if (local_78.size == 0) {
        TextLabel::text((QString *)&local_58,this->detailedTextLabel);
        qVar1 = local_58.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        if (qVar1 != 0) goto LAB_0016d30e;
        iVar5 = 0;
        QWidget::setGeometry((QWidget *)this->textLabel,iVar4,ay,0,0);
        QWidget::setGeometry((QWidget *)this->detailedTextLabel,iVar4,ay,0,0);
        iVar9 = (QVar11.y2 - ay) + 1;
        if (iVar9 - iVar8 != 0 && iVar8 <= iVar9) {
          iVar5 = (iVar9 - iVar8) / 2;
        }
        this_00 = this->accessoryWidget;
        iVar4 = iVar3 + iVar4;
        ay = ay + iVar5;
        iVar8 = ((int)local_60 - iVar4) + 1;
        iVar9 = iVar9 + iVar5 * -2;
        goto LAB_0016d4ac;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_0016d30e:
      TextLabel::text((QString *)&local_78,this->textLabel);
      if (local_78.size == 0) {
        TextLabel::text((QString *)&local_58,this->detailedTextLabel);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        if (local_58.size == 0) {
          QWidget::setGeometry((QWidget *)this->textLabel,iVar4,ay,0,0);
          QWidget::setGeometry((QWidget *)this->detailedTextLabel,iVar4,ay,0,0);
          this_00 = this->accessoryWidget;
          goto LAB_0016d4a7;
        }
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      }
      iVar9 = (QVar11.y2 - ay) + 1;
      iVar4 = 0;
      if (iVar9 - iVar8 != 0 && iVar8 <= iVar9) {
        iVar4 = (iVar9 - iVar8) / 2;
      }
      QWidget::setGeometry
                (this->accessoryWidget,((int)local_60 - iVar5) + 1,ay + iVar4,iVar5,
                 iVar9 + iVar4 * -2);
    }
    setTextGeometry(this,&r,iVar3,iVar5);
  }
  else {
    QPixmap::~QPixmap((QPixmap *)&local_78);
LAB_0016d1bb:
    if ((iVar8 != 0 && -1 < lVar6) && 0 < iVar5) {
LAB_0016d23a:
      uVar7 = (**(code **)(*(long *)this->imageLabel + 0x70))();
      QWidget::setGeometry
                ((QWidget *)this->imageLabel,iVar4,ay,(int)uVar7,(int)((ulong)uVar7 >> 0x20));
      iVar3 = (**(code **)(*(long *)this + 0x60))(this);
      iVar3 = iVar3 + (int)uVar7;
      goto LAB_0016d270;
    }
    TextLabel::text((QString *)&local_78,this->textLabel);
    if (local_78.size != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      goto LAB_0016d23a;
    }
    TextLabel::text((QString *)&local_58,this->detailedTextLabel);
    qVar1 = local_58.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    if (qVar1 != 0) goto LAB_0016d23a;
    QWidget::setGeometry((QRect *)this->imageLabel);
    QWidget::setGeometry((QWidget *)this->textLabel,r.x1,r.y1,0,0);
    QWidget::setGeometry((QWidget *)this->detailedTextLabel,r.x1,r.y1,0,0);
    this_00 = this->accessoryWidget;
    iVar4 = r.x1;
    ay = r.y1;
LAB_0016d4a7:
    iVar8 = 0;
    iVar9 = 0;
LAB_0016d4ac:
    QWidget::setGeometry(this_00,iVar4,ay,iVar8,iVar9);
  }
  return;
}

Assistant:

void
TableViewCellLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int imageOffset = 0;

	const QSize accessorySizeHint = accessoryWidget->sizeHint();

	if( imageLabel->pixmap( Qt::ReturnByValue ).isNull() || !imageLabel->text().isEmpty() )
	{
		if( accessorySizeHint.isEmpty() && textLabel->text().isEmpty() &&
			detailedTextLabel->text().isEmpty() )
		{
			imageLabel->setGeometry( r );
			textLabel->setGeometry( r.x(), r.y(), 0, 0 );
			detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
			accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

			return;
		}

		const QSize imageSize = imageLabel->sizeHint();

		imageLabel->setGeometry( r.x(), r.y(),
			imageSize.width(), imageSize.height() );

		imageOffset += imageSize.width() + spacing();
	}
	else
		imageLabel->setGeometry( r.x(), r.y(), 0, 0 );

	if( accessorySizeHint.isEmpty() )
	{
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

		setTextGeometry( r, imageOffset, 0 );
	}
	else if( textLabel->text().isEmpty() && detailedTextLabel->text().isEmpty() &&
		!accessorySizeHint.isEmpty() )
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );

		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + imageOffset, r.y() + offset,
			r.width() - imageOffset, r.height() - offset * 2 );
	}
	else if( ( !textLabel->text().isEmpty() || !detailedTextLabel->text().isEmpty() ) &&
		!accessorySizeHint.isEmpty() )
	{
		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + r.width() -
			accessorySizeHint.width(), r.y() + offset,
			accessorySizeHint.width(), r.height() - offset * 2 );

		setTextGeometry( r, imageOffset, accessorySizeHint.width() );
	}
	else
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );
	}
}